

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsCompMesh.cpp
# Opt level: O2

void __thiscall TPZMultiphysicsCompMesh::TPZMultiphysicsCompMesh(TPZMultiphysicsCompMesh *this)

{
  *(undefined ***)&this->super_TPZCompMesh = &PTR__TPZSavable_0175ad50;
  TPZCompMesh::TPZCompMesh(&this->super_TPZCompMesh,&PTR_PTR_0175ab68);
  *(undefined ***)&this->super_TPZCompMesh = &PTR__TPZMultiphysicsCompMesh_0175aa50;
  TPZManVector<int,_5>::TPZManVector(&this->m_active_approx_spaces,0);
  TPZManVector<TPZCompMesh_*,_7>::TPZManVector(&this->m_mesh_vector,0);
  TPZManVector<int,_5>::Resize(&this->m_active_approx_spaces,0);
  TPZManVector<TPZCompMesh_*,_7>::Resize(&this->m_mesh_vector,0);
  return;
}

Assistant:

TPZMultiphysicsCompMesh::TPZMultiphysicsCompMesh() : TPZCompMesh(){
    
    m_active_approx_spaces.Resize(0);
    m_mesh_vector.Resize(0);
}